

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

uint32_t ucnv_extFindToU(uint32_t *toUSection,int32_t length,uint8_t byte)

{
  uint uVar1;
  int iVar2;
  int local_34;
  int local_30;
  int32_t limit;
  int32_t start;
  int32_t i;
  uint32_t word;
  uint32_t word0;
  uint8_t byte_local;
  int32_t length_local;
  uint32_t *toUSection_local;
  
  uVar1 = *toUSection >> 0x18;
  if ((byte < uVar1) || (toUSection[length + -1] >> 0x18 < (uint)byte)) {
    toUSection_local._4_4_ = 0;
  }
  else if (length == ((toUSection[length + -1] >> 0x18) - uVar1) + 1) {
    toUSection_local._4_4_ = toUSection[(int)(byte - uVar1)] & 0xffffff;
  }
  else {
    uVar1 = (uint)byte << 0x18;
    local_30 = 0;
    local_34 = length;
    iVar2 = local_30;
    while (local_30 = iVar2, iVar2 = local_30, 1 < local_34 - local_30) {
      if (local_34 - local_30 < 5) {
        if (((toUSection[local_30] < uVar1) &&
            ((iVar2 = local_30 + 1, local_34 <= iVar2 || (toUSection[iVar2] < uVar1)))) &&
           ((iVar2 = local_30 + 2, local_34 <= iVar2 || (toUSection[iVar2] < uVar1)))) {
          iVar2 = local_30 + 3;
        }
        break;
      }
      iVar2 = (local_30 + local_34) / 2;
      if ((uVar1 | 0xffffff) < toUSection[iVar2]) {
        local_34 = iVar2;
        iVar2 = local_30;
      }
    }
    local_30 = iVar2;
    if ((local_30 < local_34) && ((uint)byte == toUSection[local_30] >> 0x18)) {
      toUSection_local._4_4_ = toUSection[local_30] & 0xffffff;
    }
    else {
      toUSection_local._4_4_ = 0;
    }
  }
  return toUSection_local._4_4_;
}

Assistant:

static inline uint32_t
ucnv_extFindToU(const uint32_t *toUSection, int32_t length, uint8_t byte) {
    uint32_t word0, word;
    int32_t i, start, limit;

    /* check the input byte against the lowest and highest section bytes */
    start=(int32_t)UCNV_EXT_TO_U_GET_BYTE(toUSection[0]);
    limit=(int32_t)UCNV_EXT_TO_U_GET_BYTE(toUSection[length-1]);
    if(byte<start || limit<byte) {
        return 0; /* the byte is out of range */
    }

    if(length==((limit-start)+1)) {
        /* direct access on a linear array */
        return UCNV_EXT_TO_U_GET_VALUE(toUSection[byte-start]); /* could be 0 */
    }

    /* word0 is suitable for <=toUSection[] comparison, word for <toUSection[] */
    word0=UCNV_EXT_TO_U_MAKE_WORD(byte, 0);

    /*
     * Shift byte once instead of each section word and add 0xffffff.
     * We will compare the shifted/added byte (bbffffff) against
     * section words which have byte values in the same bit position.
     * If and only if byte bb < section byte ss then bbffffff<ssvvvvvv
     * for all v=0..f
     * so we need not mask off the lower 24 bits of each section word.
     */
    word=word0|UCNV_EXT_TO_U_VALUE_MASK;

    /* binary search */
    start=0;
    limit=length;
    for(;;) {
        i=limit-start;
        if(i<=1) {
            break; /* done */
        }
        /* start<limit-1 */

        if(i<=4) {
            /* linear search for the last part */
            if(word0<=toUSection[start]) {
                break;
            }
            if(++start<limit && word0<=toUSection[start]) {
                break;
            }
            if(++start<limit && word0<=toUSection[start]) {
                break;
            }
            /* always break at start==limit-1 */
            ++start;
            break;
        }

        i=(start+limit)/2;
        if(word<toUSection[i]) {
            limit=i;
        } else {
            start=i;
        }
    }

    /* did we really find it? */
    if(start<limit && byte==UCNV_EXT_TO_U_GET_BYTE(word=toUSection[start])) {
        return UCNV_EXT_TO_U_GET_VALUE(word); /* never 0 */
    } else {
        return 0; /* not found */
    }
}